

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_optimizeRational(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,bool *interrupt)

{
  undefined1 *puVar1;
  double dVar2;
  Real RVar3;
  bool bVar4;
  Settings *pSVar5;
  SPxOut *extraout_RAX;
  undefined8 extraout_RAX_00;
  SPxOut *pSVar6;
  Verbosity old_verbosity;
  Verbosity VVar7;
  int iVar8;
  Verbosity old_verbosity_10;
  undefined4 uVar9;
  undefined4 uVar10;
  bool error;
  bool hasUnboundedRay;
  bool infeasible;
  bool stoppedTime;
  bool stoppedIter;
  bool unbounded;
  bool dualFeasible;
  bool primalFeasible;
  SPxOut *local_1a8;
  uint local_1a0;
  uint local_19c;
  SolRational *local_198;
  int local_190;
  int local_18c;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_188;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_180;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_178;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_170;
  SolRational solUnbounded;
  cpp_dec_float<100U,_int,_void> local_80;
  
  hasUnboundedRay = false;
  (*this->_statistics->solvingTime->_vptr_Timer[3])();
  (*this->_statistics->preprocessingTime->_vptr_Timer[3])();
  (*this->_statistics->initialPrecisionTime->_vptr_Timer[3])();
  this->_lastSolveMode = 2;
  this->_statistics->precBoosts = 0;
  if (this->_isRealLPLoaded == false) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::loadLP(&this->_solver,this->_realLP,true);
    spx_free<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&this->_realLP);
    this->_realLP =
         &(this->_solver).
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    this->_isRealLPLoaded = true;
  }
  else if (this->_hasBasis == true) {
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::reSize(&this->_basisStatusRows,
             (this->_realLP->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::reSize(&this->_basisStatusCols,
             (this->_realLP->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getBasis(&this->_solver,(this->_basisStatusRows).data,(this->_basisStatusCols).data,
               (this->_basisStatusRows).thesize,(this->_basisStatusCols).thesize);
  }
  _storeLPReal(this);
  pSVar5 = this->_currentSettings;
  dVar2 = pSVar5->_realParamValues[6];
  uVar9 = SUB84(dVar2,0);
  uVar10 = (undefined4)((ulong)dVar2 >> 0x20);
  if (((-dVar2 < pSVar5->_realParamValues[8]) ||
      (pSVar5->_realParamValues[9] <= dVar2 && dVar2 != pSVar5->_realParamValues[9])) &&
     (VVar7 = (this->spxout).m_verbosity, 3 < (int)VVar7)) {
    (this->spxout).m_verbosity = INFO2;
    soplex::operator<<(&this->spxout,"Deactivating objective limit.\n");
    (this->spxout).m_verbosity = VVar7;
    RVar3 = this->_currentSettings->_realParamValues[6];
    uVar9 = SUB84(RVar3,0);
    uVar10 = (undefined4)((ulong)RVar3 >> 0x20);
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_80,(double)CONCAT44(uVar10,uVar9),(type *)0x0);
  (this->_solver).objLimit.m_backend.data._M_elems[0xc] = local_80.data._M_elems[0xc];
  (this->_solver).objLimit.m_backend.data._M_elems[0xd] = local_80.data._M_elems[0xd];
  (this->_solver).objLimit.m_backend.data._M_elems[0xe] = local_80.data._M_elems[0xe];
  (this->_solver).objLimit.m_backend.data._M_elems[0xf] = local_80.data._M_elems[0xf];
  (this->_solver).objLimit.m_backend.data._M_elems[8] = local_80.data._M_elems[8];
  (this->_solver).objLimit.m_backend.data._M_elems[9] = local_80.data._M_elems[9];
  (this->_solver).objLimit.m_backend.data._M_elems[10] = local_80.data._M_elems[10];
  (this->_solver).objLimit.m_backend.data._M_elems[0xb] = local_80.data._M_elems[0xb];
  (this->_solver).objLimit.m_backend.data._M_elems[4] = local_80.data._M_elems[4];
  (this->_solver).objLimit.m_backend.data._M_elems[5] = local_80.data._M_elems[5];
  (this->_solver).objLimit.m_backend.data._M_elems[6] = local_80.data._M_elems[6];
  (this->_solver).objLimit.m_backend.data._M_elems[7] = local_80.data._M_elems[7];
  (this->_solver).objLimit.m_backend.data._M_elems[0] = local_80.data._M_elems[0];
  (this->_solver).objLimit.m_backend.data._M_elems[1] = local_80.data._M_elems[1];
  (this->_solver).objLimit.m_backend.data._M_elems[2] = local_80.data._M_elems[2];
  (this->_solver).objLimit.m_backend.data._M_elems[3] = local_80.data._M_elems[3];
  (this->_solver).objLimit.m_backend.exp = local_80.exp;
  (this->_solver).objLimit.m_backend.neg = local_80.neg;
  (this->_solver).objLimit.m_backend.fpclass = local_80.fpclass;
  (this->_solver).objLimit.m_backend.prec_elem = local_80.prec_elem;
  (*this->_statistics->preprocessingTime->_vptr_Timer[4])();
  pSVar5 = this->_currentSettings;
  if (pSVar5->_boolParamValues[0] == true) {
    _lift(this);
    pSVar5 = this->_currentSettings;
  }
  local_18c = pSVar5->_intParamValues[1];
  if ((DAT_0054d624 < 2) && (0 < DAT_0054d694)) {
    pSVar5->_intParamValues[1] = 1;
  }
  local_190 = pSVar5->_intParamValues[0xe];
  if (local_190 == 3) {
    setIntParam(this,RATIOTESTER,2,true);
    pSVar5 = this->_currentSettings;
  }
  if (pSVar5->_boolParamValues[1] == true) {
    _transformEquality(this);
  }
  local_180 = &this->_solver;
  this->_storedBasis = false;
  local_198 = &this->_solRational;
  local_1a8 = &this->spxout;
  local_188 = &(this->_solRational)._primalRay;
  local_170 = &(this->_solRational)._dual;
  local_178 = &(this->_solRational)._redCost;
  local_19c = 0;
  local_1a0 = 0;
  while( true ) {
    primalFeasible = false;
    dualFeasible = false;
    infeasible = false;
    unbounded = false;
    error = false;
    stoppedTime = false;
    stoppedIter = false;
    this->_certificateMode = 0;
    _performOptIRWrapper
              (this,local_198,(bool)(~(byte)local_19c & 1),(bool)(~(byte)local_1a0 & 1),0,
               &primalFeasible,&dualFeasible,&infeasible,&unbounded,&stoppedTime,&stoppedIter,&error
              );
    if (error == true) {
      this->_status = ERROR;
      goto LAB_0038cd0d;
    }
    if (stoppedTime == true) {
      this->_status = ABORT_TIME;
      goto LAB_0038cd0d;
    }
    if (stoppedIter == true) {
      this->_status = ABORT_ITER;
      goto LAB_0038cd0d;
    }
    if (((local_19c & 1) != 0) || (unbounded == false)) break;
    SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::SolBase(&solUnbounded);
    this->_certificateMode = 2;
    _performUnboundedIRStable(this,&solUnbounded,&hasUnboundedRay,&stoppedTime,&stoppedIter,&error);
    if (error == true) {
      VVar7 = (this->spxout).m_verbosity;
      if (2 < (int)VVar7) {
        (this->spxout).m_verbosity = INFO1;
        soplex::operator<<(local_1a8,"Error while testing for unboundedness.\n");
LAB_0038c7a0:
        (this->spxout).m_verbosity = VVar7;
      }
LAB_0038c7a3:
      this->_status = ERROR;
      goto LAB_0038c92e;
    }
    VVar7 = (this->spxout).m_verbosity;
    pSVar6 = extraout_RAX;
    if (hasUnboundedRay == true) {
      if (2 < (int)VVar7) {
        (this->spxout).m_verbosity = INFO1;
        pSVar6 = soplex::operator<<(local_1a8,"Dual infeasible.  Primal unbounded ray available.\n")
        ;
LAB_0038c8fd:
        (this->spxout).m_verbosity = VVar7;
      }
    }
    else if (2 < (int)VVar7) {
      (this->spxout).m_verbosity = INFO1;
      pSVar6 = soplex::operator<<(local_1a8,"Dual feasible.  Rejecting primal unboundedness.\n");
      goto LAB_0038c8fd;
    }
    local_19c = (uint)CONCAT71((int7)((ulong)pSVar6 >> 8),hasUnboundedRay) ^ 1;
    if (stoppedTime == true) {
LAB_0038c911:
      this->_status = ABORT_TIME;
      goto LAB_0038c92e;
    }
    if (stoppedIter == true) {
LAB_0038c924:
      this->_status = ABORT_ITER;
      goto LAB_0038c92e;
    }
    this->_certificateMode = 1;
    _performFeasIRStable(this,local_198,&infeasible,&stoppedTime,&stoppedIter,&error);
    if (hasUnboundedRay == true) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator=(local_188,&solUnbounded._primalRay);
      puVar1 = &(this->_solRational).field_0xd0;
      *puVar1 = *puVar1 | 2;
    }
    if (error == true) {
      VVar7 = (this->spxout).m_verbosity;
      if (2 < (int)VVar7) {
        (this->spxout).m_verbosity = INFO1;
        soplex::operator<<(local_1a8,"Error while testing for feasibility.\n");
        goto LAB_0038c7a0;
      }
      goto LAB_0038c7a3;
    }
    if (stoppedTime == true) goto LAB_0038c911;
    if (stoppedIter == true) goto LAB_0038c924;
    if (infeasible == true) {
      VVar7 = (this->spxout).m_verbosity;
      if (2 < (int)VVar7) {
        (this->spxout).m_verbosity = INFO1;
        soplex::operator<<(local_1a8,"Primal infeasible.  Dual Farkas ray available.\n");
        (this->spxout).m_verbosity = VVar7;
      }
      this->_status = INFEASIBLE;
LAB_0038c92e:
      iVar8 = 2;
    }
    else {
      VVar7 = (this->spxout).m_verbosity;
      if (hasUnboundedRay == true) {
        if (2 < (int)VVar7) {
          (this->spxout).m_verbosity = INFO1;
          soplex::operator<<(local_1a8,"Primal feasible and unbounded.\n");
          (this->spxout).m_verbosity = VVar7;
        }
        this->_status = UNBOUNDED;
        goto LAB_0038c92e;
      }
      if (2 < (int)VVar7) {
        (this->spxout).m_verbosity = INFO1;
        soplex::operator<<(local_1a8,"Primal feasible and bounded.\n");
        (this->spxout).m_verbosity = VVar7;
      }
      iVar8 = 3;
    }
    SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~SolBase(&solUnbounded);
LAB_0038c93b:
    if (iVar8 == 2) goto LAB_0038cd0d;
LAB_0038cb50:
    bVar4 = _isSolveStopped(this,&stoppedTime,&stoppedIter);
    if (bVar4) {
LAB_0038cd0d:
      this->_switchedToBoosted = false;
      this->_hasOldBasis = false;
      this->_hasOldFeasBasis = false;
      this->_hasOldUnbdBasis = false;
      if ((uint)(this->_status + RUNNING) < 3) {
        this->_hasSolRational = true;
      }
      if (this->_currentSettings->_boolParamValues[1] == true) {
        _untransformEquality(this,local_198);
      }
      setIntParam(this,REPRESENTATION,local_18c,true);
      setIntParam(this,RATIOTESTER,local_190,true);
      if (this->_currentSettings->_boolParamValues[0] == true) {
        _project(this,local_198);
      }
      _restoreLPReal(this);
      if (this->_hasBasis == true) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setBasis(local_180,(this->_basisStatusRows).data,(this->_basisStatusCols).data);
        this->_hasBasis =
             NO_PROBLEM <
             (this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thestatus;
        if ((uint)(this->_status + RUNNING) < 3) {
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setBasisStatus(local_180,this->_status + PRIMAL);
        }
      }
      (*this->_statistics->initialPrecisionTime->_vptr_Timer[4])();
      (*this->_statistics->extendedPrecisionTime->_vptr_Timer[4])();
      (*this->_statistics->solvingTime->_vptr_Timer[4])();
      return;
    }
  }
  if (((local_1a0 & 1) == 0) && (infeasible != false)) {
    _storeBasis(this);
    this->_certificateMode = 1;
    _performFeasIRStable(this,local_198,&infeasible,&stoppedTime,&stoppedIter,&error);
    if (error == true) {
      VVar7 = (this->spxout).m_verbosity;
      if (2 < (int)VVar7) {
        (this->spxout).m_verbosity = INFO1;
        soplex::operator<<(local_1a8,"Error while testing for infeasibility.\n");
        (this->spxout).m_verbosity = VVar7;
      }
      this->_status = ERROR;
    }
    else if (stoppedTime == true) {
      this->_status = ABORT_TIME;
    }
    else {
      if (stoppedIter != true) {
        local_1a0 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),infeasible) ^ 1;
        if ((infeasible != false) && (this->_currentSettings->_boolParamValues[2] == true)) {
          SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::SolBase(&solUnbounded);
          this->_certificateMode = 2;
          _performUnboundedIRStable
                    (this,&solUnbounded,&hasUnboundedRay,&stoppedTime,&stoppedIter,&error);
          bVar4 = error;
          if (error == true) {
            VVar7 = (this->spxout).m_verbosity;
            if (2 < (int)VVar7) {
              (this->spxout).m_verbosity = INFO1;
              soplex::operator<<(local_1a8,"Error while testing for dual infeasibility.\n");
              (this->spxout).m_verbosity = VVar7;
            }
            this->_status = ERROR;
            _restoreBasis(this);
            iVar8 = 2;
          }
          else {
            if (hasUnboundedRay == true) {
              VVar7 = (this->spxout).m_verbosity;
              if (2 < (int)VVar7) {
                (this->spxout).m_verbosity = INFO1;
                soplex::operator<<(local_1a8,"Dual infeasible.  Primal unbounded ray available.\n");
                (this->spxout).m_verbosity = VVar7;
              }
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator=(local_188,&solUnbounded._primalRay);
              puVar1 = &(this->_solRational).field_0xd0;
              *puVar1 = *puVar1 | 2;
            }
            else {
              VVar7 = (this->spxout).m_verbosity;
              if ((solUnbounded._208_1_ & 4) == 0) {
                iVar8 = 0;
                if (2 < (int)VVar7) {
                  (this->spxout).m_verbosity = INFO1;
                  soplex::operator<<(local_1a8,"Not dual infeasible.\n");
                  (this->spxout).m_verbosity = VVar7;
                }
                goto LAB_0038caef;
              }
              if (2 < (int)VVar7) {
                (this->spxout).m_verbosity = INFO1;
                soplex::operator<<(local_1a8,"Dual feasible.  Storing dual multipliers.\n");
                (this->spxout).m_verbosity = VVar7;
              }
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator=(local_170,&solUnbounded._dual);
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator=(local_178,&solUnbounded._redCost);
              puVar1 = &(this->_solRational).field_0xd0;
              *puVar1 = *puVar1 | 4;
            }
            iVar8 = 0;
          }
LAB_0038caef:
          SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::~SolBase(&solUnbounded);
          if (bVar4 != false) goto LAB_0038c93b;
        }
        _restoreBasis(this);
        if (infeasible == true) {
          VVar7 = (this->spxout).m_verbosity;
          if (2 < (int)VVar7) {
            (this->spxout).m_verbosity = INFO1;
            soplex::operator<<(local_1a8,"Primal infeasible.  Dual Farkas ray available.\n");
            (this->spxout).m_verbosity = VVar7;
          }
          this->_status = INFEASIBLE;
        }
        else {
          VVar7 = (this->spxout).m_verbosity;
          if (hasUnboundedRay != true) {
            if (2 < (int)VVar7) {
              (this->spxout).m_verbosity = INFO1;
              soplex::operator<<(local_1a8,"Primal feasible.  Optimizing again.\n");
              (this->spxout).m_verbosity = VVar7;
            }
            goto LAB_0038cb50;
          }
          if (2 < (int)VVar7) {
            (this->spxout).m_verbosity = INFO1;
            soplex::operator<<(local_1a8,"Primal feasible and unbounded.\n");
            (this->spxout).m_verbosity = VVar7;
          }
          this->_status = UNBOUNDED;
        }
        goto LAB_0038cd0d;
      }
      this->_status = ABORT_ITER;
    }
    _restoreBasis(this);
  }
  else if ((primalFeasible == true) && (dualFeasible == true)) {
    VVar7 = (this->spxout).m_verbosity;
    if (2 < (int)VVar7) {
      (this->spxout).m_verbosity = INFO1;
      soplex::operator<<(local_1a8,"Solved to optimality.\n");
      (this->spxout).m_verbosity = VVar7;
    }
    this->_status = OPTIMAL;
  }
  else {
    VVar7 = (this->spxout).m_verbosity;
    if (2 < (int)VVar7) {
      (this->spxout).m_verbosity = INFO1;
      soplex::operator<<(local_1a8,"Terminating without success.\n");
      (this->spxout).m_verbosity = VVar7;
    }
  }
  goto LAB_0038cd0d;
}

Assistant:

void SoPlexBase<R>::_optimizeRational(volatile bool* interrupt)
{
#ifndef SOPLEX_WITH_BOOST
   SPX_MSG_ERROR(std::cerr << "ERROR: rational solve without Boost not defined!" << std::endl;)
   return;
#else
   bool hasUnboundedRay = false;
   bool infeasibilityNotCertified = false;
   bool unboundednessNotCertified = false;

   // start timing
   _statistics->solvingTime->start();
   _statistics->preprocessingTime->start();
   _statistics->initialPrecisionTime->start();

   // remember that last solve was rational
   _lastSolveMode = SOLVEMODE_RATIONAL;
   _resetBoostedPrecision();

   // ensure that the solver has the original problemo
   if(!_isRealLPLoaded)
   {
      assert(_realLP != &_solver);

      _solver.loadLP(*_realLP);
      spx_free(_realLP);
      _realLP = &_solver;
      _isRealLPLoaded = true;
   }
   // during the rational solve, we always store basis information in the basis arrays
   else if(_hasBasis)
   {
      _basisStatusRows.reSize(numRows());
      _basisStatusCols.reSize(numCols());
      _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(), _basisStatusRows.size(),
                       _basisStatusCols.size());
   }

   // store objective, bounds, and sides of Real LP in case they will be modified during iterative refinement
   _storeLPReal();

   // deactivate objective limit in floating-point solver
   if(realParam(SoPlexBase<R>::OBJLIMIT_LOWER) > -realParam(SoPlexBase<R>::INFTY)
         || realParam(SoPlexBase<R>::OBJLIMIT_UPPER) < realParam(SoPlexBase<R>::INFTY))
   {
      SPX_MSG_INFO2(spxout, spxout << "Deactivating objective limit.\n");
   }

   _solver.setTerminationValue(realParam(SoPlexBase<R>::INFTY));

   _statistics->preprocessingTime->stop();

   // apply lifting to reduce range of nonzero matrix coefficients
   if(boolParam(SoPlexBase<R>::LIFTING))
      _lift();

   // force column representation
   ///@todo implement row objectives with row representation
   int oldRepresentation = intParam(SoPlexBase<R>::REPRESENTATION);
   setIntParam(SoPlexBase<R>::REPRESENTATION, SoPlexBase<R>::REPRESENTATION_COLUMN);

   // force ratio test (avoid bound flipping)
   int oldRatiotester = intParam(SoPlexBase<R>::RATIOTESTER);

   if(oldRatiotester == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING)
      setIntParam(SoPlexBase<R>::RATIOTESTER, SoPlexBase<R>::RATIOTESTER_FAST);

   ///@todo implement handling of row objectives in Cplex interface
#ifdef SOPLEX_WITH_CPX
   int oldEqtrans = boolParam(SoPlexBase<R>::EQTRANS);
   setBoolParam(SoPlexBase<R>::EQTRANS, true);
#endif

   // introduce slack variables to transform inequality constraints into equations
   if(boolParam(SoPlexBase<R>::EQTRANS))
      _transformEquality();

   _storedBasis = false;

   bool stoppedTime;
   bool stoppedIter;

   do
   {
      bool primalFeasible = false;
      bool dualFeasible = false;
      bool infeasible = false;
      bool unbounded = false;
      bool error = false;
      stoppedTime = false;
      stoppedIter = false;

      // indicate we are solving the original LP
      _switchToStandardMode();

      /// solve problem with iterative refinement and the right precision
      _performOptIRWrapper(_solRational, !unboundednessNotCertified, !infeasibilityNotCertified, 0,
                           primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error);

#ifdef SOPLEX_WITH_MPFR

      // case: an unrecoverable error occured, and precision boosting has reached its limit
      if(error && _boostingLimitReached)
      {
         _status = SPxSolverBase<R>::ERROR;
         break;
      }
      // case: an error occured, boost precision
      else if(error)
#else

      // case: an unrecoverable error occured, boost precision
      if(error)
#endif
      {
         _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

         if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
         {
            if(_setupBoostedSolverAfterRecovery())
               continue;
            else // precision boosting has reached its limit
               break;
         }
         else
            break;

#else
         break;
#endif
      }
      // case: stopped due to some limit
      else if(stoppedTime)
      {
         _status = SPxSolverBase<R>::ABORT_TIME;
         break;
      }
      else if(stoppedIter)
      {
         _status = SPxSolverBase<R>::ABORT_ITER;
         break;
      }
      // case: unboundedness detected for the first time
      else if(unbounded && !unboundednessNotCertified)
      {
         SolRational solUnbounded;

         // indicate we are testing unboundedness
         _switchToUnbdMode();

         _performUnboundedIRStable(solUnbounded, hasUnboundedRay, stoppedTime, stoppedIter, error);

         assert(!hasUnboundedRay || solUnbounded.hasPrimalRay());
         assert(!solUnbounded.hasPrimalRay() || hasUnboundedRay);

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for unboundedness.\n");
            _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }

         if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Dual infeasible.  Primal unbounded ray available.\n");
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Dual feasible.  Rejecting primal unboundedness.\n");
         }

         unboundednessNotCertified = !hasUnboundedRay;

         if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            break;
         }

         // indicate we are testing feasibility
         _switchToFeasMode();

         _performFeasIRStable(_solRational, infeasible, stoppedTime, stoppedIter, error);

         ///@todo this should be stored already earlier, possible switch use solRational above and solFeas here
         if(hasUnboundedRay)
         {
            _solRational._primalRay = solUnbounded._primalRay;
            _solRational._hasPrimalRay = true;
         }

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for feasibility.\n");
            _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }
         else if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            break;
         }
         else if(infeasible)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal infeasible.  Dual Farkas ray available.\n");
            _status = SPxSolverBase<R>::INFEASIBLE;
            break;
         }
         else if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and unbounded.\n");
            _status = SPxSolverBase<R>::UNBOUNDED;
            break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and bounded.\n");
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }

#endif
            continue;
         }
      }
      // case: infeasibility detected
      else if(infeasible && !infeasibilityNotCertified)
      {
         _storeBasis();

         // indicate we are testing feasibility
         _switchToFeasMode();

         _performFeasIRStable(_solRational, infeasible, stoppedTime, stoppedIter, error);

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for infeasibility.\n");
            _status = SPxSolverBase<R>::ERROR;
            _restoreBasis();
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }

         infeasibilityNotCertified = !infeasible;

         if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            _restoreBasis();
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            _restoreBasis();
            break;
         }

         if(infeasible && boolParam(SoPlexBase<R>::TESTDUALINF))
         {
            SolRational solUnbounded;

            // indicate we are testing unboundedness
            // not sure about this.
            _switchToUnbdMode();

            _performUnboundedIRStable(solUnbounded, hasUnboundedRay, stoppedTime, stoppedIter, error);

            assert(!hasUnboundedRay || solUnbounded.hasPrimalRay());
            assert(!solUnbounded.hasPrimalRay() || hasUnboundedRay);

            if(error)
            {
               SPX_MSG_INFO1(spxout, spxout << "Error while testing for dual infeasibility.\n");
               _status = SPxSolverBase<R>::ERROR;
               _restoreBasis();
#ifdef SOPLEX_WITH_MPFR

               if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
               {
                  if(_setupBoostedSolverAfterRecovery())
                     continue;
                  else // precision boosting has reached its limit
                     break;
               }
               else
                  break;

#else
               break;
#endif
            }

            if(hasUnboundedRay)
            {
               SPX_MSG_INFO1(spxout, spxout << "Dual infeasible.  Primal unbounded ray available.\n");
               _solRational._primalRay = solUnbounded._primalRay;
               _solRational._hasPrimalRay = true;
            }
            else if(solUnbounded._isDualFeasible)
            {
               SPX_MSG_INFO1(spxout, spxout << "Dual feasible.  Storing dual multipliers.\n");
               _solRational._dual = solUnbounded._dual;
               _solRational._redCost = solUnbounded._redCost;
               _solRational._isDualFeasible = true;
            }
            else
            {
               assert(false);
               SPX_MSG_INFO1(spxout, spxout << "Not dual infeasible.\n");
            }
         }

         _restoreBasis();

         if(infeasible)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal infeasible.  Dual Farkas ray available.\n");
            _status = SPxSolverBase<R>::INFEASIBLE;
            break;
         }
         else if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and unbounded.\n");
            _status = SPxSolverBase<R>::UNBOUNDED;
            break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible.  Optimizing again.\n");
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }

#endif
            continue;
         }
      }
      else if(primalFeasible && dualFeasible)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solved to optimality.\n");
         _status = SPxSolverBase<R>::OPTIMAL;
         break;
      }
      else
      {
#ifdef SOPLEX_WITH_MPFR

         if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
         {
            if(_setupBoostedSolverAfterRecovery())
               continue;
            else // precision boosting has reached its limit
               break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Terminating without success.\n");
            break;
         }

#else
         SPX_MSG_INFO1(spxout, spxout << "Terminating without success.\n");
         break;
#endif
      }
   }
   while(!_isSolveStopped(stoppedTime, stoppedIter));

   // reset old basis flags for future optimization runs
   _switchedToBoosted = false;
   _hasOldBasis = false;
   _hasOldFeasBasis = false;
   _hasOldUnbdBasis = false;

   ///@todo set status to ABORT_VALUE if optimal solution exceeds objective limit

   if(_status == SPxSolverBase<R>::OPTIMAL || _status == SPxSolverBase<R>::INFEASIBLE
         || _status == SPxSolverBase<R>::UNBOUNDED)
      _hasSolRational = true;

   // restore original problem
   if(boolParam(SoPlexBase<R>::EQTRANS))
      _untransformEquality(_solRational);

#ifdef SOPLEX_WITH_CPX
   setBoolParam(SoPlexBase<R>::EQTRANS, oldEqtrans);
#endif

   // reset representation and ratio test
   setIntParam(SoPlexBase<R>::REPRESENTATION, oldRepresentation);
   setIntParam(SoPlexBase<R>::RATIOTESTER, oldRatiotester);

   // undo lifting
   if(boolParam(SoPlexBase<R>::LIFTING))
      _project(_solRational);

   // restore objective, bounds, and sides of Real LP in case they have been modified during iterative refinement
   _restoreLPReal();

   // since the Real LP is loaded in the solver, we need to also pass the basis information to the solver if
   // available
   if(_hasBasis)
   {
      assert(_isRealLPLoaded);
      _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);

      // since setBasis always sets the basis status to regular, we need to set it manually here
      switch(_status)
      {
      case SPxSolverBase<R>::OPTIMAL:
         _solver.setBasisStatus(SPxBasisBase<R>::OPTIMAL);
         break;

      case SPxSolverBase<R>::INFEASIBLE:
         _solver.setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
         break;

      case SPxSolverBase<R>::UNBOUNDED:
         _solver.setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
         break;

      default:
         break;
      }

   }

   // stop timing
   _statistics->initialPrecisionTime->stop();
   _statistics->extendedPrecisionTime->stop();
   _statistics->solvingTime->stop();
#endif
}

/// perform iterative refinement using the right precision
template <class R>
void SoPlexBase<R>::_performOptIRWrapper(
   SolRational& sol,
   bool acceptUnbounded,
   bool acceptInfeasible,
   int minIRRoundsRemaining,
   bool& primalFeasible,
   bool& dualFeasible,
   bool& infeasible,
   bool& unbounded,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error
)
{
   _solver.setSolvingForBoosted(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));
   _boostedSolver.setSolvingForBoosted(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));

#ifdef SOPLEX_WITH_MPFR

   if(boolParam(SoPlexBase<R>::ITERATIVE_REFINEMENT))
   {
      // no precision boosting or initial precision -> solve with plain iterative refinement
      if(!boolParam(SoPlexBase<R>::PRECISION_BOOSTING) || !_switchedToBoosted)
      {
         _performOptIRStable(sol, acceptUnbounded, acceptInfeasible, minIRRoundsRemaining,
                             primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error);
      }
      else
      {
         do
         {
            // setup boosted solver for the new iteration
            _setupBoostedSolver();
            // solve problem with iterative refinement and recovery mechanism, using multiprecision
            // return false if a new boosted iteration is needed, true otherwise
            bool needNewBoostedIt;
            _performOptIRStableBoosted(sol, acceptUnbounded, acceptInfeasible, minIRRoundsRemaining,
                                       primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error,
                                       needNewBoostedIt);

            // update statistics for precision boosting
            _updateBoostingStatistics();

            // boost precision if no success
            if(needNewBoostedIt)
            {
               if(!_boostPrecision())
               {
                  // error message already displayed
                  error = true;
                  break;
               }
            }
            else
               break;
         }
         while(true);
      }